

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAcesFile.cpp
# Opt level: O0

void Imf_2_5::anon_unknown_14::checkCompression(Compression compression)

{
  ArgExc *this;
  int in_EDI;
  
  if (((in_EDI != 0) && (in_EDI != 4)) && (in_EDI != 7)) {
    this = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(this,"Invalid compression type for ACES file.");
    __cxa_throw(this,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  return;
}

Assistant:

void
checkCompression (Compression compression)
{
    //
    // Not all compression methods are allowed in ACES files.
    //

    switch (compression)
    {
      case NO_COMPRESSION:
      case PIZ_COMPRESSION:
      case B44A_COMPRESSION:
	break;

      default:
	throw ArgExc ("Invalid compression type for ACES file.");
    }
}